

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O2

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<6> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  int *piVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint32_t *puVar6;
  long lVar7;
  pointer pvVar8;
  uint *puVar9;
  PointDVector<unsigned_int> *pPVar10;
  PointDVectorIterator PVar11;
  PointDVectorIterator end_00;
  long lVar12;
  uint32_t uVar13;
  uint uVar14;
  _Elt_pointer pEVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  uint32_t i;
  ulong uVar19;
  uint32_t j;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *old_base;
  VectorUint32 *levels;
  bool bVar24;
  PointDVectorIterator split;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_138;
  DirectBitEncoder *local_f8;
  FoldedBit32Encoder<draco::RAnsBitEncoder> *local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  PointDVector<unsigned_int> *local_d0;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  value_type local_78;
  
  PVar11 = end;
  local_78.begin.item_ = local_78.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_78,(allocator_type *)&local_138)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  local_78.begin.item_ = local_78.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_78,(allocator_type *)&local_138)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&status_stack);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&status_stack);
  local_78.begin.item_ = begin.item_;
  pPVar10 = begin.vec_;
  local_78.begin.dimensionality_ = begin.dimensionality_;
  local_78.begin._20_4_ = begin._20_4_;
  local_78.end.item_ = end.item_;
  sVar17 = local_78.end.item_;
  local_78.end.vec_ = end.vec_;
  local_78.end.dimensionality_ = end.dimensionality_;
  local_78.end._20_4_ = end._20_4_;
  local_78.last_axis = 0;
  local_78.stack_pos = 0;
  local_78.end.item_._0_4_ = (int)PVar11.item_;
  local_78.num_remaining_points = (int)local_78.end.item_ - (int)begin.item_;
  local_78.begin.vec_ = pPVar10;
  local_78.end.item_ = sVar17;
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>,void>
            (&status_stack);
  std::
  deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::push_back(&status_stack.c,&local_78);
  local_f8 = &this->half_encoder_;
  local_f0 = &this->numbers_encoder_;
  local_d0 = pPVar10;
  while (status_stack.c.
         super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         status_stack.c.
         super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pEVar15 = status_stack.c.
              super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        status_stack.c.
        super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pEVar15 = status_stack.c.
                super__Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
    }
    sVar17 = pEVar15[-1].begin.item_;
    sVar5 = pEVar15[-1].end.item_;
    uVar13 = pEVar15[-1].last_axis;
    uVar2 = pEVar15[-1].stack_pos;
    uVar19 = (ulong)uVar2;
    std::
    deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
    ::pop_back(&status_stack.c);
    begin.item_._0_4_ = (int)sVar17;
    local_d8 = uVar19 * 0x18;
    old_base = (this->base_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar19;
    levels = (this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar19;
    PVar11.vec_._0_4_ = begin.vec_._0_4_;
    PVar11.item_ = sVar17;
    PVar11.vec_._4_4_ = begin.vec_._4_4_;
    PVar11.dimensionality_ = begin.dimensionality_;
    PVar11._20_4_ = begin._20_4_;
    end_00.vec_ = end.vec_;
    end_00.item_ = sVar5;
    end_00.dimensionality_ = end.dimensionality_;
    end_00._20_4_ = end._20_4_;
    uVar13 = GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                       (this,PVar11,end_00,old_base,levels,uVar13);
    uVar19 = (ulong)uVar13;
    uVar3 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar19];
    uVar4 = this->bit_length_;
    if (uVar4 != uVar3) {
      uVar14 = (uint)(sVar5 - sVar17);
      if (uVar14 < 3) {
        puVar6 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *puVar6 = uVar13;
        uVar19 = 1;
        while( true ) {
          uVar16 = (ulong)this->dimension_;
          if (uVar16 <= uVar19) break;
          bVar24 = uVar13 == this->dimension_ - 1;
          uVar13 = uVar13 + 1;
          if (bVar24) {
            uVar13 = 0;
          }
          puVar6[uVar19] = uVar13;
          uVar19 = uVar19 + 1;
        }
        for (uVar19 = 0; uVar19 != (uVar14 & 3); uVar19 = uVar19 + 1) {
          uVar2 = local_d0->dimensionality_;
          puVar9 = local_d0->data0_;
          for (uVar21 = 0; uVar21 < uVar16; uVar21 = uVar21 + 1) {
            uVar18 = (ulong)(this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar21];
            iVar22 = this->bit_length_ -
                     (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar18];
            if (iVar22 != 0) {
              DirectBitEncoder::EncodeLeastSignificantBits32
                        (&this->remaining_bits_encoder_,iVar22,
                         puVar9[(ulong)uVar2 * (sVar17 + uVar19) + uVar18]);
              uVar16 = (ulong)this->dimension_;
            }
          }
        }
      }
      else {
        local_e8 = (ulong)(uVar2 + 1);
        local_e0 = local_e8 * 0x18;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_e8,old_base);
        lVar12 = local_e0;
        lVar7 = *(long *)((long)&(((this->base_stack_).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_e0);
        iVar22 = (1 << ((char)uVar4 + ~(byte)uVar3 & 0x1f)) + *(int *)(lVar7 + uVar19 * 4);
        *(int *)(lVar7 + uVar19 * 4) = iVar22;
        std::
        __partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<6>::Splitter>
                  (&split,CONCAT44(iVar22,uVar13));
        uVar23 = (int)sVar5 - (int)split.item_;
        uVar20 = (int)split.item_ - (int)begin.item_;
        if (uVar20 != uVar23) {
          DirectBitEncoder::EncodeBit(local_f8,uVar20 < uVar23);
        }
        iVar22 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar22 == 0; iVar22 = iVar22 + -1) {
          }
        }
        if (uVar20 < uVar23) {
          uVar23 = uVar20;
        }
        FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
                  (local_f0,iVar22,((uint)(sVar5 - sVar17 >> 1) & 0x7fffffff) - uVar23);
        pvVar8 = (this->levels_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar1 = (int *)(*(long *)((long)&(pvVar8->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + local_d8) + uVar19 * 4
                        );
        *piVar1 = *piVar1 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data + lVar12),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data + local_d8));
        if (CONCAT44(split.item_._4_4_,(int)split.item_) != sVar17) {
          local_138.begin.dimensionality_ = begin.dimensionality_;
          local_138.begin._20_4_ = begin._20_4_;
          local_138.end.dimensionality_ = split.dimensionality_;
          local_138.end._20_4_ = split._20_4_;
          local_138.end.item_ = CONCAT44(split.item_._4_4_,(int)split.item_);
          local_138.end.vec_ = split.vec_;
          local_138.num_remaining_points = (int)split.item_ - (int)begin.item_;
          local_138.begin.item_ = sVar17;
          local_138.begin.vec_ = pPVar10;
          local_138.last_axis = uVar13;
          local_138.stack_pos = uVar2;
          std::
          deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
          ::
          emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                    ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                      *)&status_stack,&local_138);
          sVar17 = CONCAT44(split.item_._4_4_,(int)split.item_);
        }
        if (sVar17 != sVar5) {
          local_138.begin.dimensionality_ = split.dimensionality_;
          local_138.begin._20_4_ = split._20_4_;
          local_138.begin.item_ = CONCAT44(split.item_._4_4_,(int)split.item_);
          local_138.begin.vec_ = split.vec_;
          local_138.end.dimensionality_ = end.dimensionality_;
          local_138.end._20_4_ = end._20_4_;
          local_138.end.vec_ = end.vec_;
          local_138.stack_pos = (uint32_t)local_e8;
          local_138.num_remaining_points = (int)sVar5 - (int)split.item_;
          local_138.end.item_ = sVar5;
          local_138.last_axis = uVar13;
          std::
          deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
          ::
          emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                    ((deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                      *)&status_stack,&local_138);
        }
      }
    }
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::~_Deque_base((_Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
                  *)&status_stack);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}